

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laser.cpp
# Opt level: O3

void __thiscall CLaser::Snap(CLaser *this,int SnappingClient)

{
  float fVar1;
  IServer *pIVar2;
  int iVar3;
  int *piVar4;
  uint uVar5;
  undefined4 extraout_var;
  
  iVar3 = CEntity::NetworkClipped(&this->super_CEntity,SnappingClient);
  if ((iVar3 != 0) &&
     (iVar3 = CEntity::NetworkClipped(&this->super_CEntity,SnappingClient,this->m_From), iVar3 != 0)
     ) {
    return;
  }
  pIVar2 = ((this->super_CEntity).m_pGameWorld)->m_pServer;
  iVar3 = (*(pIVar2->super_IInterface)._vptr_IInterface[0x10])
                    (pIVar2,3,(ulong)(uint)(this->super_CEntity).m_ID,0x14);
  piVar4 = (int *)CONCAT44(extraout_var,iVar3);
  if (piVar4 != (int *)0x0) {
    fVar1 = (this->super_CEntity).m_Pos.field_0.x;
    uVar5 = -(uint)(0.0 < fVar1);
    *piVar4 = (int)((float)(~uVar5 & 0xbf000000 | uVar5 & 0x3f000000) + fVar1);
    fVar1 = (this->super_CEntity).m_Pos.field_1.y;
    uVar5 = -(uint)(0.0 < fVar1);
    piVar4[1] = (int)((float)(~uVar5 & 0xbf000000 | uVar5 & 0x3f000000) + fVar1);
    fVar1 = (this->m_From).field_0.x;
    uVar5 = -(uint)(0.0 < fVar1);
    piVar4[2] = (int)((float)(~uVar5 & 0xbf000000 | uVar5 & 0x3f000000) + fVar1);
    fVar1 = (this->m_From).field_1.y;
    uVar5 = -(uint)(0.0 < fVar1);
    piVar4[3] = (int)((float)(~uVar5 & 0xbf000000 | uVar5 & 0x3f000000) + fVar1);
    piVar4[4] = this->m_EvalTick;
  }
  return;
}

Assistant:

void CLaser::Snap(int SnappingClient)
{
	if(NetworkClipped(SnappingClient) && NetworkClipped(SnappingClient, m_From))
		return;

	CNetObj_Laser *pObj = static_cast<CNetObj_Laser *>(Server()->SnapNewItem(NETOBJTYPE_LASER, GetID(), sizeof(CNetObj_Laser)));
	if(!pObj)
		return;

	pObj->m_X = round_to_int(m_Pos.x);
	pObj->m_Y = round_to_int(m_Pos.y);
	pObj->m_FromX = round_to_int(m_From.x);
	pObj->m_FromY = round_to_int(m_From.y);
	pObj->m_StartTick = m_EvalTick;
}